

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool __thiscall absl::lts_20250127::Cord::EndsWith(Cord *this,Cord *rhs)

{
  CordRep *pCVar1;
  undefined1 local_40 [8];
  Cord tmp;
  size_t rhs_size;
  size_t my_size;
  Cord *rhs_local;
  Cord *this_local;
  
  pCVar1 = (CordRep *)size(this);
  tmp.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)size(rhs);
  if (pCVar1 < tmp.contents_.data_.rep_.field_0.as_tree.rep) {
    this_local._7_1_ = false;
  }
  else {
    Cord((Cord *)local_40,this);
    RemovePrefix((Cord *)local_40,(long)pCVar1 - tmp.contents_.data_.rep_.field_0._8_8_);
    this_local._7_1_ =
         EqualsImpl((Cord *)local_40,rhs,(size_t)tmp.contents_.data_.rep_.field_0.as_tree.rep);
    ~Cord((Cord *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool Cord::EndsWith(const Cord& rhs) const {
  size_t my_size = size();
  size_t rhs_size = rhs.size();

  if (my_size < rhs_size) return false;

  Cord tmp(*this);
  tmp.RemovePrefix(my_size - rhs_size);
  return tmp.EqualsImpl(rhs, rhs_size);
}